

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::DescriptorPoolCreateInfo::DescriptorPoolCreateInfo
          (DescriptorPoolCreateInfo *this,
          vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
          *poolSizeCounts,VkDescriptorPoolCreateFlags _flags,deUint32 _maxSets)

{
  size_type sVar1;
  reference pvVar2;
  deUint32 _maxSets_local;
  VkDescriptorPoolCreateFlags _flags_local;
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *poolSizeCounts_local;
  DescriptorPoolCreateInfo *this_local;
  
  std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
            (&this->m_poolSizeCounts,poolSizeCounts);
  (this->super_VkDescriptorPoolCreateInfo).sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  (this->super_VkDescriptorPoolCreateInfo).pNext = (void *)0x0;
  (this->super_VkDescriptorPoolCreateInfo).flags = _flags;
  (this->super_VkDescriptorPoolCreateInfo).maxSets = _maxSets;
  sVar1 = std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::size
                    (&this->m_poolSizeCounts);
  (this->super_VkDescriptorPoolCreateInfo).poolSizeCount = (deUint32)sVar1;
  pvVar2 = std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
           operator[](&this->m_poolSizeCounts,0);
  (this->super_VkDescriptorPoolCreateInfo).pPoolSizes = pvVar2;
  return;
}

Assistant:

DescriptorPoolCreateInfo::DescriptorPoolCreateInfo (const std::vector<vk::VkDescriptorPoolSize>&	poolSizeCounts,
													vk::VkDescriptorPoolCreateFlags					_flags,
													deUint32										_maxSets)
	: m_poolSizeCounts(poolSizeCounts)
{
	sType = vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
	pNext = DE_NULL;
	flags			= _flags;
	maxSets			= _maxSets;
	poolSizeCount	= static_cast<deUint32>(m_poolSizeCounts.size());
	pPoolSizes		= &m_poolSizeCounts[0];
}